

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_util.h
# Opt level: O2

bool cali::util::is_one_of(char c,char *characters)

{
  char cVar1;
  char *ptr;
  
  do {
    cVar1 = *characters;
    if (cVar1 == c) break;
    characters = characters + 1;
  } while (cVar1 != '\0');
  return cVar1 != '\0';
}

Assistant:

inline bool is_one_of(char c, const char* characters)
{
    for (const char* ptr = characters; *ptr != '\0'; ++ptr)
        if (*ptr == c)
            return true;

    return false;
}